

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.cpp
# Opt level: O3

Aggregate * __thiscall
hta::Metric::aggregate_raw
          (Aggregate *__return_storage_ptr__,Metric *this,TimePoint begin,TimePoint end)

{
  double minimum;
  duration dVar1;
  Aggregate other;
  Aggregate other_00;
  long *plVar2;
  type partial_duration;
  vector<hta::TimeValue,_std::allocator<hta::TimeValue>_> raw;
  Aggregate partial_interval;
  Duration local_b0;
  long *local_a8;
  long *local_a0;
  long local_98;
  Aggregate local_90;
  Aggregate local_60;
  
  __return_storage_ptr__->minimum = INFINITY;
  __return_storage_ptr__->maximum = -INFINITY;
  __return_storage_ptr__->sum = 0.0;
  __return_storage_ptr__->count = 0;
  __return_storage_ptr__->integral = 0.0;
  (__return_storage_ptr__->active_time).__r = 0;
  (*((this->storage_metric_)._M_t.
     super___uniq_ptr_impl<hta::storage::Metric,_std::default_delete<hta::storage::Metric>_>._M_t.
     super__Tuple_impl<0UL,_hta::storage::Metric_*,_std::default_delete<hta::storage::Metric>_>.
     super__Head_base<0UL,_hta::storage::Metric_*,_false>._M_head_impl)->_vptr_Metric[5])(&local_a8)
  ;
  plVar2 = local_a8;
  while( true ) {
    if (plVar2 == local_a0) {
      if (local_a8 != (long *)0x0) {
        operator_delete(local_a8,local_98 - (long)local_a8);
      }
      return __return_storage_ptr__;
    }
    dVar1.__r = *plVar2;
    if (dVar1.__r <
        (long)begin.
              super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              .__d.__r) break;
    minimum = (double)plVar2[1];
    if (dVar1.__r <
        (long)end.
              super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              .__d.__r) {
      Aggregate::Aggregate
                (&local_90,minimum,
                 (Duration)
                 (dVar1.__r -
                 (long)begin.
                       super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                       .__d.__r));
      other.maximum = local_90.maximum;
      other.minimum = local_90.minimum;
      other.sum = local_90.sum;
      other.count = local_90.count;
      other.integral = local_90.integral;
      other.active_time.__r = local_90.active_time.__r;
      Aggregate::operator+=(__return_storage_ptr__,other);
    }
    else {
      local_b0.__r = (long)end.
                           super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                           .__d.__r -
                     (long)begin.
                           super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                           .__d.__r;
      Aggregate::Aggregate(&local_60,minimum,minimum,0.0,0,(double)local_b0.__r * minimum,&local_b0)
      ;
      other_00.maximum = local_60.maximum;
      other_00.minimum = local_60.minimum;
      other_00.sum = local_60.sum;
      other_00.count = local_60.count;
      other_00.integral = local_60.integral;
      other_00.active_time.__r = local_60.active_time.__r;
      Aggregate::operator+=(__return_storage_ptr__,other_00);
    }
    plVar2 = plVar2 + 2;
    begin.super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
    __d.__r = (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
              (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
              dVar1.__r;
  }
  __assert_fail("previous_time <= tv.time",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/metric.cpp"
                ,0x78,"Aggregate hta::Metric::aggregate_raw(TimePoint, TimePoint)");
}

Assistant:

Aggregate Metric::aggregate_raw(TimePoint begin, TimePoint end)
{
    Aggregate aggregate;
    const auto raw =
        storage_metric_->get(begin, end, IntervalScope{ Scope::closed, Scope::extended });
    auto previous_time = begin;
    for (auto tv : raw)
    {
        assert(previous_time <= tv.time);
        if (tv.time >= end)
        {
            // We add this for the integral but the point isn't actually in
            auto partial_duration = end - previous_time;
            Aggregate partial_interval{
                tv.value, tv.value, 0, 0, tv.value * partial_duration.count(), partial_duration
            };
            aggregate += partial_interval;
        }
        else
        {
            aggregate += Aggregate(tv.value, tv.time - previous_time);
        }
        previous_time = tv.time;
    }
    return aggregate;
}